

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.c
# Opt level: O0

int uv_spawn(uv_loop_t *loop,uv_process_t *process,uv_process_options_t *options)

{
  __pid_t _Var1;
  uv_process_options_t *options_00;
  int *piVar2;
  ssize_t sVar3;
  QUEUE *papvVar4;
  undefined8 *in_RDX;
  long in_RSI;
  long in_RDI;
  int i;
  int exec_errorno;
  int err;
  pid_t pid;
  ssize_t r;
  QUEUE *q;
  int stdio_count;
  int (*pipes) [2];
  int signal_pipe [2];
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  int iVar5;
  int iVar6;
  undefined4 in_stack_ffffffffffffffac;
  int local_50;
  undefined8 in_stack_ffffffffffffffb8;
  int (*in_stack_ffffffffffffffc0) [2];
  int stdio_count_00;
  
  if (in_RDX[1] == 0) {
    __assert_fail("options->file != NULL","src/unix/process.c",0x16a,
                  "int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  if ((*(uint *)(in_RDX + 5) & 0xffffffe0) != 0) {
    __assert_fail("!(options->flags & ~(UV_PROCESS_DETACHED | UV_PROCESS_SETGID | UV_PROCESS_SETUID | UV_PROCESS_WINDOWS_HIDE | UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS))"
                  ,"src/unix/process.c",0x16f,
                  "int uv_spawn(uv_loop_t *, uv_process_t *, const uv_process_options_t *)");
  }
  *(long *)(in_RSI + 0x10) = in_RDI;
  *(undefined4 *)(in_RSI + 0x18) = 10;
  *(undefined4 *)(in_RSI + 0x30) = 0x2000;
  *(long *)(in_RSI + 0x20) = in_RDI + 0x10;
  *(undefined8 *)(in_RSI + 0x28) = *(undefined8 *)(in_RDI + 0x18);
  **(long **)(in_RSI + 0x28) = in_RSI + 0x20;
  *(long *)(in_RDI + 0x18) = in_RSI + 0x20;
  *(undefined8 *)(in_RSI + 0x38) = 0;
  *(long *)(in_RSI + 0x50) = in_RSI + 0x50;
  *(long *)(in_RSI + 0x58) = in_RSI + 0x50;
  stdio_count_00 = *(int *)((long)in_RDX + 0x2c);
  if (stdio_count_00 < 3) {
    stdio_count_00 = 3;
  }
  local_50 = -0xc;
  options_00 = (uv_process_options_t *)malloc((long)stdio_count_00 << 3);
  if (options_00 != (uv_process_options_t *)0x0) {
    for (iVar6 = 0; iVar6 < stdio_count_00; iVar6 = iVar6 + 1) {
      *(undefined4 *)(&options_00->exit_cb + iVar6) = 0xffffffff;
      *(undefined4 *)((long)&options_00->exit_cb + (long)iVar6 * 8 + 4) = 0xffffffff;
    }
    for (iVar6 = 0; iVar5 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
        iVar6 < *(int *)((long)in_RDX + 0x2c); iVar6 = iVar6 + 1) {
      local_50 = uv__process_init_stdio
                           ((uv_stdio_container_t *)CONCAT44(in_stack_ffffffffffffffac,iVar6),
                            (int *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      if (local_50 != 0) goto LAB_001131b0;
    }
    local_50 = uv__make_pipe((int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0)
    ;
    if (local_50 == 0) {
      uv_signal_start((uv_signal_t *)q,(uv_signal_cb)r,pid);
      _Var1 = fork();
      if (_Var1 == -1) {
        piVar2 = __errno_location();
        local_50 = -*piVar2;
        uv__close(in_stack_ffffffffffffffa4);
        uv__close(in_stack_ffffffffffffffa4);
      }
      else {
        if (_Var1 == 0) {
          uv__process_child_init(options_00,stdio_count_00,in_stack_ffffffffffffffc0,iVar5);
          abort();
        }
        uv__close(in_stack_ffffffffffffffa4);
        *(undefined4 *)(in_RSI + 0x60) = 0;
        iVar6 = 0;
        do {
          sVar3 = read(-1,&stack0xffffffffffffffac,4);
          in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 & 0xffffff;
          if (sVar3 == -1) {
            piVar2 = __errno_location();
            in_stack_ffffffffffffffa4 = CONCAT13(*piVar2 == 4,(int3)in_stack_ffffffffffffffa4);
          }
        } while ((char)(in_stack_ffffffffffffffa4 >> 0x18) != '\0');
        if (((sVar3 != 0) && (sVar3 != 4)) &&
           ((sVar3 != -1 || (piVar2 = __errno_location(), *piVar2 != 0x20)))) {
          abort();
        }
        uv__close(in_stack_ffffffffffffffa4);
        iVar5 = 0;
        while( true ) {
          if (*(int *)((long)in_RDX + 0x2c) <= iVar5) {
            if (iVar6 == 0) {
              papvVar4 = uv__process_queue((uv_loop_t *)
                                           CONCAT44(in_stack_ffffffffffffffa4,
                                                    in_stack_ffffffffffffffa0),
                                           in_stack_ffffffffffffff9c);
              *(QUEUE **)(in_RSI + 0x50) = papvVar4;
              *(void **)(in_RSI + 0x58) = (*papvVar4)[1];
              **(long **)(in_RSI + 0x58) = in_RSI + 0x50;
              (*papvVar4)[1] = (void *)(in_RSI + 0x50);
              if (((*(uint *)(in_RSI + 0x30) & 0x4000) == 0) &&
                 (*(uint *)(in_RSI + 0x30) = *(uint *)(in_RSI + 0x30) | 0x4000,
                 (*(uint *)(in_RSI + 0x30) & 0x2000) != 0)) {
                *(int *)(*(long *)(in_RSI + 0x10) + 8) = *(int *)(*(long *)(in_RSI + 0x10) + 8) + 1;
              }
            }
            *(__pid_t *)(in_RSI + 0x48) = _Var1;
            *(undefined8 *)(in_RSI + 0x40) = *in_RDX;
            free(options_00);
            return iVar6;
          }
          local_50 = uv__process_open_stream
                               ((uv_stdio_container_t *)CONCAT44(iVar6,iVar5),
                                (int *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                                ,in_stack_ffffffffffffff9c);
          if (local_50 != 0) break;
          iVar5 = iVar5 + 1;
        }
        while (iVar6 = iVar5 + -1, iVar5 != 0) {
          uv__process_close_stream((uv_stdio_container_t *)0x11307c);
          iVar5 = iVar6;
        }
      }
    }
  }
LAB_001131b0:
  if (options_00 != (uv_process_options_t *)0x0) {
    for (iVar6 = 0; iVar6 < stdio_count_00; iVar6 = iVar6 + 1) {
      if ((*(int *)((long)in_RDX + 0x2c) <= iVar6) ||
         ((*(uint *)(in_RDX[6] + (long)iVar6 * 0x10) & 6) == 0)) {
        if (*(int *)(&options_00->exit_cb + iVar6) != -1) {
          close(*(int *)(&options_00->exit_cb + iVar6));
        }
        if (*(int *)((long)&options_00->exit_cb + (long)iVar6 * 8 + 4) != -1) {
          close(*(int *)((long)&options_00->exit_cb + (long)iVar6 * 8 + 4));
        }
      }
    }
    free(options_00);
  }
  return local_50;
}

Assistant:

int uv_spawn(uv_loop_t* loop,
             uv_process_t* process,
             const uv_process_options_t* options) {
  int signal_pipe[2] = { -1, -1 };
  int (*pipes)[2];
  int stdio_count;
  QUEUE* q;
  ssize_t r;
  pid_t pid;
  int err;
  int exec_errorno;
  int i;

  assert(options->file != NULL);
  assert(!(options->flags & ~(UV_PROCESS_DETACHED |
                              UV_PROCESS_SETGID |
                              UV_PROCESS_SETUID |
                              UV_PROCESS_WINDOWS_HIDE |
                              UV_PROCESS_WINDOWS_VERBATIM_ARGUMENTS)));

  uv__handle_init(loop, (uv_handle_t*)process, UV_PROCESS);
  QUEUE_INIT(&process->queue);

  stdio_count = options->stdio_count;
  if (stdio_count < 3)
    stdio_count = 3;

  err = -ENOMEM;
  pipes = malloc(stdio_count * sizeof(*pipes));
  if (pipes == NULL)
    goto error;

  for (i = 0; i < stdio_count; i++) {
    pipes[i][0] = -1;
    pipes[i][1] = -1;
  }

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_init_stdio(options->stdio + i, pipes[i]);
    if (err)
      goto error;
  }

  /* This pipe is used by the parent to wait until
   * the child has called `execve()`. We need this
   * to avoid the following race condition:
   *
   *    if ((pid = fork()) > 0) {
   *      kill(pid, SIGTERM);
   *    }
   *    else if (pid == 0) {
   *      execve("/bin/cat", argp, envp);
   *    }
   *
   * The parent sends a signal immediately after forking.
   * Since the child may not have called `execve()` yet,
   * there is no telling what process receives the signal,
   * our fork or /bin/cat.
   *
   * To avoid ambiguity, we create a pipe with both ends
   * marked close-on-exec. Then, after the call to `fork()`,
   * the parent polls the read end until it EOFs or errors with EPIPE.
   */
  err = uv__make_pipe(signal_pipe, 0);
  if (err)
    goto error;

  uv_signal_start(&loop->child_watcher, uv__chld, SIGCHLD);

  pid = fork();

  if (pid == -1) {
    err = -errno;
    uv__close(signal_pipe[0]);
    uv__close(signal_pipe[1]);
    goto error;
  }

  if (pid == 0) {
    uv__process_child_init(options, stdio_count, pipes, signal_pipe[1]);
    abort();
  }

  uv__close(signal_pipe[1]);

  process->status = 0;
  exec_errorno = 0;
  do
    r = read(signal_pipe[0], &exec_errorno, sizeof(exec_errorno));
  while (r == -1 && errno == EINTR);

  if (r == 0)
    ; /* okay, EOF */
  else if (r == sizeof(exec_errorno))
    ; /* okay, read errorno */
  else if (r == -1 && errno == EPIPE)
    ; /* okay, got EPIPE */
  else
    abort();

  uv__close(signal_pipe[0]);

  for (i = 0; i < options->stdio_count; i++) {
    err = uv__process_open_stream(options->stdio + i, pipes[i], i == 0);
    if (err == 0)
      continue;

    while (i--)
      uv__process_close_stream(options->stdio + i);

    goto error;
  }

  /* Only activate this handle if exec() happened successfully */
  if (exec_errorno == 0) {
    q = uv__process_queue(loop, pid);
    QUEUE_INSERT_TAIL(q, &process->queue);
    uv__handle_start(process);
  }

  process->pid = pid;
  process->exit_cb = options->exit_cb;

  free(pipes);
  return exec_errorno;

error:
  if (pipes != NULL) {
    for (i = 0; i < stdio_count; i++) {
      if (i < options->stdio_count)
        if (options->stdio[i].flags & (UV_INHERIT_FD | UV_INHERIT_STREAM))
          continue;
      if (pipes[i][0] != -1)
        close(pipes[i][0]);
      if (pipes[i][1] != -1)
        close(pipes[i][1]);
    }
    free(pipes);
  }

  return err;
}